

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

uchar * __thiscall cxxopts::OptionValue::as<unsigned_char>(OptionValue *this)

{
  bool bVar1;
  element_type *peVar2;
  abstract_value<unsigned_char> *this_00;
  uchar *puVar3;
  allocator<char> local_31;
  string local_30;
  OptionValue *local_10;
  OptionValue *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->m_value,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"No value",&local_31);
    throw_or_mimic<std::domain_error>(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  this_00 = (abstract_value<unsigned_char> *)
            __dynamic_cast(peVar2,&Value::typeinfo,&values::standard_value<unsigned_char>::typeinfo,
                           0);
  if (this_00 != (abstract_value<unsigned_char> *)0x0) {
    puVar3 = values::abstract_value<unsigned_char>::get(this_00);
    return puVar3;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
        throw_or_mimic<std::domain_error>("No value");
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }